

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::pointer_writer<unsigned_long>&>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          pointer_writer<unsigned_long> *f)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  size_t __len;
  size_t __n;
  char __tmp;
  uint uVar4;
  size_t __len_1;
  checked_ptr<typename_buffer<char>::value_type> pcVar5;
  ulong __n_00;
  checked_ptr<typename_buffer<char>::value_type> local_30;
  
  uVar2 = specs->width;
  uVar4 = f->num_digits + 2;
  if (uVar4 < uVar2) {
    local_30 = reserve<fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,
                          (ulong)uVar2);
    bVar1 = (specs->fill).data_[0];
    __n = (ulong)uVar2 - (ulong)uVar4;
    bVar3 = specs->field_0x9 & 0xf;
    if (bVar3 == 3) {
      __n_00 = __n >> 1;
      pcVar5 = local_30;
      if (1 < __n) {
        pcVar5 = local_30 + __n_00;
        memset(local_30,(uint)bVar1,__n_00);
      }
      local_30 = pcVar5;
      pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
      __n = __n - __n_00;
    }
    else {
      if (bVar3 == 2) {
        pcVar5 = local_30 + __n;
        memset(local_30,(uint)bVar1,__n);
        local_30 = pcVar5;
        pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
        return;
      }
      pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
    }
    memset(local_30,(uint)bVar1,__n);
  }
  else {
    local_30 = reserve<fmt::v6::internal::buffer<char>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,
                          (ulong)uVar4);
    pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }